

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgflusher.cc
# Opt level: O3

void * bgflusher_thread(void *voidargs)

{
  filemgr *file;
  err_log_callback *log_callback;
  uint8_t uVar1;
  avl_node *node;
  avl_node *paVar2;
  uint64_t uVar3;
  pthread_mutex_t *__mutex;
  long lVar4;
  bool bVar5;
  filemgr_open_result fVar6;
  timespec ts;
  
  __mutex = &bgf_lock;
  while( true ) {
    pthread_mutex_lock((pthread_mutex_t *)&bgf_lock);
    node = avl_first(&openfiles);
    if (node == (avl_node *)0x0) {
      bVar5 = true;
    }
    else {
      lVar4 = 0;
      do {
        file = (filemgr *)node[-0xc].right;
        if (file == (filemgr *)0x0) {
          paVar2 = avl_next(node);
          avl_remove(&openfiles,node);
          free(node + -0x36);
        }
        else if (*(char *)((long)&node[-1].left + 4) == '\x01') {
          paVar2 = avl_next(node);
        }
        else {
          *(undefined1 *)((long)&node[-1].left + 4) = 1;
          log_callback = (err_log_callback *)node[-1].right;
          fVar6 = filemgr_open(file->filename,file->ops,file->config,log_callback);
          pthread_mutex_unlock((pthread_mutex_t *)&bgf_lock);
          if (fVar6.rv == FDB_RESULT_SUCCESS) {
            uVar3 = filemgr_flush_immutable(file,log_callback);
            lVar4 = lVar4 + uVar3;
            filemgr_close(file,false,file->filename,log_callback);
          }
          else {
            fdb_log_impl(log_callback,2,fVar6.rv,
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/bgflusher.cc"
                         ,"bgflusher_thread",0x7f,
                         "Failed to open the file \'%s\' for background flushing\n.",file->filename)
            ;
          }
          pthread_mutex_lock((pthread_mutex_t *)&bgf_lock);
          *(undefined1 *)((long)&node[-1].left + 4) = 0;
          paVar2 = avl_next(node);
          if (bgflusher_terminate_signal != '\0') goto LAB_00109b07;
        }
        node = paVar2;
      } while (paVar2 != (avl_node *)0x0);
      bVar5 = lVar4 == 0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&bgf_lock);
    pthread_mutex_lock((pthread_mutex_t *)&sync_mutex);
    if (bgflusher_terminate_signal != '\0') break;
    if (bVar5) {
      ts = convert_reltime_to_abstime(2000);
      pthread_cond_timedwait
                ((pthread_cond_t *)&sync_cond,(pthread_mutex_t *)&sync_mutex,(timespec *)&ts);
    }
    uVar1 = bgflusher_terminate_signal;
    pthread_mutex_unlock((pthread_mutex_t *)&sync_mutex);
    if (uVar1 != '\0') {
      return (void *)0x0;
    }
  }
  __mutex = &sync_mutex;
LAB_00109b07:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return (void *)0x0;
}

Assistant:

static void * bgflusher_thread(void *voidargs)
{
    fdb_status fs;
    struct avl_node *a;
    struct filemgr *file;
    struct openfiles_elem *elem;
    err_log_callback *log_callback = NULL;

    while (1) {
        uint64_t num_blocks = 0;

        mutex_lock(&bgf_lock);
        a = avl_first(&openfiles);
        while(a) {
            filemgr_open_result ffs;
            elem = _get_entry(a, struct openfiles_elem, avl);
            file = elem->file;
            if (!file) {
                a = avl_next(a);
                avl_remove(&openfiles, &elem->avl);
                free(elem);
                continue;
            }

            if (elem->background_flush_in_progress) {
                a = avl_next(a);
            } else {
                elem->background_flush_in_progress = true;
                log_callback = elem->log_callback;
                ffs = filemgr_open(file->filename, file->ops,
                        file->config, log_callback);
                fs = (fdb_status)ffs.rv;
                mutex_unlock(&bgf_lock);
                if (fs == FDB_RESULT_SUCCESS) {
                    num_blocks += filemgr_flush_immutable(file,
                                                          log_callback);
                    filemgr_close(file, 0, file->filename, log_callback);

                } else {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Failed to open the file '%s' for background flushing\n.",
                            file->filename);
                }
                mutex_lock(&bgf_lock);
                elem->background_flush_in_progress = false;
                a = avl_next(&elem->avl);
                if (bgflusher_terminate_signal) {
                    mutex_unlock(&bgf_lock);
                    return NULL;
                }
            }
        }
        mutex_unlock(&bgf_lock);

        mutex_lock(&sync_mutex);
        if (bgflusher_terminate_signal) {
            mutex_unlock(&sync_mutex);
            break;
        }
        if (!num_blocks) {
            thread_cond_timedwait(&sync_cond, &sync_mutex,
                                  (unsigned)(sleep_duration * 1000));
        }
        if (bgflusher_terminate_signal) {
            mutex_unlock(&sync_mutex);
            break;
        }
        mutex_unlock(&sync_mutex);
    }
    return NULL;
}